

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PEFile.cpp
# Opt level: O1

offset_t __thiscall PEFile::rawToRva(PEFile *this,offset_t raw)

{
  int iVar1;
  undefined4 extraout_var;
  SectionHdrWrapper *this_00;
  offset_t oVar2;
  offset_t oVar3;
  bufsize_t bVar4;
  long lVar5;
  offset_t oVar6;
  WatchedLocker lock;
  WatchedLocker local_60;
  undefined4 extraout_var_00;
  
  WatchedLocker::WatchedLocker(&local_60,&this->m_peMutex,false,"rawToRva");
  iVar1 = (*(this->super_MappedExe).super_Executable.super_AbstractByteBuffer.
            _vptr_AbstractByteBuffer[0xf])(this,1);
  oVar6 = 0xffffffffffffffff;
  if (raw < CONCAT44(extraout_var,iVar1)) {
    if (this->sects == (SectHdrsWrapper *)0x0) {
      this_00 = (SectionHdrWrapper *)0x0;
    }
    else {
      this_00 = SectHdrsWrapper::getSecHdrAtOffset(this->sects,raw,RAW,true,false);
    }
    if (this_00 == (SectionHdrWrapper *)0x0) {
      if (this->sects == (SectHdrsWrapper *)0x0) {
        lVar5 = 0;
      }
      else {
        iVar1 = (*(this->sects->super_PENodeWrapper).super_ExeNodeWrapper.super_ExeElementWrapper.
                  super_AbstractByteBuffer._vptr_AbstractByteBuffer[0x21])();
        lVar5 = CONCAT44(extraout_var_00,iVar1);
      }
      oVar6 = raw;
      if (lVar5 != 0) {
        bVar4 = PECore::hdrsSize(&this->core);
        oVar6 = 0xffffffffffffffff;
        if (raw < bVar4) {
          oVar6 = raw;
        }
      }
    }
    else {
      oVar2 = SectionHdrWrapper::getContentOffset(this_00,VA,true);
      oVar3 = SectionHdrWrapper::getContentOffset(this_00,RAW,true);
      if (oVar3 != 0xffffffffffffffff && oVar2 != 0xffffffffffffffff) {
        bVar4 = SectionHdrWrapper::getContentSize(this_00,VA,true);
        oVar6 = 0xffffffffffffffff;
        if (raw - oVar3 < bVar4) {
          oVar6 = oVar2 + (raw - oVar3);
        }
      }
    }
  }
  WatchedLocker::~WatchedLocker(&local_60);
  return oVar6;
}

Assistant:

offset_t PEFile::rawToRva(offset_t raw)
{
    WatchedLocker lock(&m_peMutex, PE_SHOW_LOCK, __FUNCTION__);
    if (raw >= this->getMappedSize(Executable::RAW)) return INVALID_ADDR;

    SectionHdrWrapper* sec = this->_getSecHdrAtOffset(raw, Executable::RAW, true);
    if (sec) {
        offset_t bgnVA = sec->getContentOffset(Executable::VA);
        offset_t bgnRaw = sec->getContentOffset(Executable::RAW);
        if (bgnVA  == INVALID_ADDR || bgnRaw == INVALID_ADDR) return INVALID_ADDR;

        bufsize_t curr = (raw - bgnRaw);
       
        bufsize_t vSize = sec->getContentSize(Executable::VA, true);
        if (curr >= vSize) {
            //address out of section
            return INVALID_ADDR;
        }
        return bgnVA + curr;
    }
    //TODO: make more tests
    if (this->_getSectionsCount() == 0) return raw;
    if (raw < this->hdrsSize()) {
        return raw;
    } //else: content that is between the end of sections headers and the first virtual section is not mapped
    return INVALID_ADDR;
}